

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O1

uint __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,int id,int depth,QStringList *propertyNames,
          QDBusPlatformMenu *topLevelMenu)

{
  QDBusPlatformMenu *menu;
  QDebug this_00;
  Stream *__old_val;
  QLoggingCategory *pQVar1;
  QDBusPlatformMenuItem *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QLatin1String QVar5;
  QDebug local_90;
  QDebug local_88;
  QtPrivate local_80 [8];
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar1->name;
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    QMessageLogger::debug();
    QTextStream::operator<<(&(local_90.stream)->ts,id);
    if ((local_90.stream)->space == true) {
      QTextStream::operator<<(&(local_90.stream)->ts,' ');
    }
    this_00.stream = local_90.stream;
    QVar3.m_data = &DAT_00000005;
    QVar3.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(&(this_00.stream)->ts,&local_78);
    if ((Stream *)local_78.d.d != (Stream *)0x0) {
      LOCK();
      *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
      UNLOCK();
      if (*(int *)local_78.d.d == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_90.stream)->space == true) {
      QTextStream::operator<<(&(local_90.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_90.stream)->ts,depth);
    if ((local_90.stream)->space == true) {
      QTextStream::operator<<(&(local_90.stream)->ts,' ');
    }
    (local_90.stream)->ref = (local_90.stream)->ref + 1;
    local_88.stream = (Stream *)0x0;
    local_78.d.d = (Data *)local_90.stream;
    QtPrivate::printSequentialContainer<QList<QString>>
              (local_80,(Stream *)&local_78,"QList",propertyNames);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug((QDebug *)local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
  }
  this->m_id = id;
  if (id == 0) {
    QVar4.m_data = (storage_type *)0x10;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar4);
    local_78.d.d = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
    local_78.d.ptr = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
    local_78.d.size = CONCAT44(local_58._20_4_,local_58._16_4_);
    QVar5.m_data = "submenu";
    QVar5.m_size = 7;
    ::QVariant::QVariant((QVariant *)&local_58,QVar5);
    QMap<QString,_QVariant>::insert(&this->m_properties,&local_78,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((Stream *)local_78.d.d != (Stream *)0x0) {
      LOCK();
      *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
      UNLOCK();
      if (*(int *)local_78.d.d == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    id = 1;
    if (topLevelMenu != (QDBusPlatformMenu *)0x0) {
      populate(this,topLevelMenu,depth,propertyNames);
    }
  }
  else {
    pQVar2 = QDBusPlatformMenuItem::byId((int)((ulong)propertyNames >> 0x20));
    if (pQVar2 != (QDBusPlatformMenuItem *)0x0) {
      menu = (QDBusPlatformMenu *)pQVar2->m_subMenu;
      if (menu != (QDBusPlatformMenu *)0x0) {
        if (depth != 0) {
          populate(this,menu,depth,propertyNames);
        }
        id = menu->m_revision;
      }
      if (menu != (QDBusPlatformMenu *)0x0) goto LAB_00645755;
    }
    id = 1;
  }
LAB_00645755:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return id;
  }
  __stack_chk_fail();
}

Assistant:

uint QDBusMenuLayoutItem::populate(int id, int depth, const QStringList &propertyNames, const QDBusPlatformMenu *topLevelMenu)
{
    qCDebug(qLcMenu) << id << "depth" << depth << propertyNames;
    m_id = id;
    if (id == 0) {
        m_properties.insert("children-display"_L1, "submenu"_L1);
        if (topLevelMenu)
            populate(topLevelMenu, depth, propertyNames);
        return 1; // revision
    }

    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    if (item) {
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());

        if (menu) {
            if (depth != 0)
                populate(menu, depth, propertyNames);
            return menu->revision();
        }
    }

    return 1; // revision
}